

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distribution.cpp
# Opt level: O0

void __thiscall
MxxDistribution_StableScatterBlockDistr_Test::TestBody
          (MxxDistribution_StableScatterBlockDistr_Test *this)

{
  value_type vVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  reference pvVar5;
  char *pcVar6;
  comm *pcVar7;
  AssertHelper local_150;
  Message local_148;
  uchar local_139;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_3;
  Message local_120;
  uchar local_111;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_2;
  size_t i_1;
  Message local_f0;
  size_type local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_c8;
  Message local_c0;
  size_type local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  size_t prefix;
  size_t eq_size;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_> x;
  size_t i;
  size_t size;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_> vec;
  comm c;
  MxxDistribution_StableScatterBlockDistr_Test *this_local;
  
  pcVar7 = (comm *)((long)&vec.field_2 + 8);
  mxx::comm::comm(pcVar7);
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  basic_string((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                *)&size);
  iVar3 = mxx::comm::rank(pcVar7);
  iVar4 = mxx::comm::size((comm *)((long)&vec.field_2 + 8));
  pcVar7 = (comm *)((long)iVar4 / 2 & 0xffffffff);
  if (iVar3 == (int)((long)iVar4 / 2)) {
    std::__cxx11::
    basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
    resize((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
            *)&size,0x28);
    for (x.field_2._8_8_ = 0; (ulong)x.field_2._8_8_ < 0x28; x.field_2._8_8_ = x.field_2._8_8_ + 1)
    {
      vVar1 = (value_type)x.field_2._8_8_;
      pvVar5 = std::__cxx11::
               basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
               ::operator[]((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                             *)&size,x.field_2._8_8_);
      pcVar7 = (comm *)CONCAT71((int7)((ulong)pcVar7 >> 8),vVar1);
      *pvVar5 = vVar1;
    }
  }
  mxx::
  stable_distribute<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>
            ((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
              *)&eq_size,(mxx *)&size,
             (basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
              *)((long)&vec.field_2 + 8),pcVar7);
  mxx::
  stable_distribute_inplace<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>
            ((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
              *)&size,(comm *)((long)&vec.field_2 + 8));
  iVar3 = mxx::comm::size((comm *)((long)&vec.field_2 + 8));
  prefix = 0x28 / (ulong)(long)iVar3;
  iVar3 = mxx::comm::rank((comm *)((long)&vec.field_2 + 8));
  iVar4 = mxx::comm::size((comm *)((long)&vec.field_2 + 8));
  if ((ulong)(long)iVar3 < 0x28U % (ulong)(long)iVar4) {
    prefix = prefix + 1;
  }
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       mxx::exscan<unsigned_long>(&prefix,(comm *)((long)&vec.field_2 + 8));
  local_b8 = std::__cxx11::
             basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
             ::size((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                     *)&eq_size);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_b0,"eq_size","x.size()",&prefix,&local_b8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar2) {
    testing::Message::Message(&local_c0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_distribution.cpp"
               ,0x59,pcVar6);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message(&local_c0);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_e8 = std::__cxx11::
               basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
               ::size((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                       *)&size);
    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
              ((EqHelper<false> *)local_e0,"eq_size","vec.size()",&prefix,&local_e8);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
    if (!bVar2) {
      testing::Message::Message(&local_f0);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&i_1,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_distribution.cpp"
                 ,0x5a,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&i_1,&local_f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_1);
      testing::Message::~Message(&local_f0);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      for (gtest_ar_2.message_.ptr_ =
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          gtest_ar_2.message_.ptr_ < prefix;
          gtest_ar_2.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(gtest_ar_2.message_.ptr_)->field_0x1) {
        local_111 = (char)gtest_ar.message_.ptr_ + (char)gtest_ar_2.message_.ptr_;
        pvVar5 = std::__cxx11::
                 basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                 ::operator[]((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                               *)&eq_size,(size_type)gtest_ar_2.message_.ptr_);
        testing::internal::EqHelper<false>::Compare<unsigned_char,unsigned_char>
                  ((EqHelper<false> *)local_110,"static_cast<unsigned char>((prefix + i) % 256)",
                   "x[i]",&local_111,pvVar5);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
        if (!bVar2) {
          testing::Message::Message(&local_120);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_distribution.cpp"
                     ,0x5d,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_3.message_,&local_120);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
          testing::Message::~Message(&local_120);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
        if (gtest_ar_1.message_.ptr_._4_4_ != 0) goto LAB_0020f49d;
        local_139 = (char)gtest_ar.message_.ptr_ + (char)gtest_ar_2.message_.ptr_;
        pvVar5 = std::__cxx11::
                 basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                 ::operator[]((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                               *)&size,(size_type)gtest_ar_2.message_.ptr_);
        testing::internal::EqHelper<false>::Compare<unsigned_char,unsigned_char>
                  ((EqHelper<false> *)local_138,"static_cast<unsigned char>((prefix + i) % 256)",
                   "vec[i]",&local_139,pvVar5);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
        if (!bVar2) {
          testing::Message::Message(&local_148);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
          testing::internal::AssertHelper::AssertHelper
                    (&local_150,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_distribution.cpp"
                     ,0x5e,pcVar6);
          testing::internal::AssertHelper::operator=(&local_150,&local_148);
          testing::internal::AssertHelper::~AssertHelper(&local_150);
          testing::Message::~Message(&local_148);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
        if (gtest_ar_1.message_.ptr_._4_4_ != 0) goto LAB_0020f49d;
      }
      gtest_ar_1.message_.ptr_._4_4_ = 0;
    }
  }
LAB_0020f49d:
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  ~basic_string((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                 *)&eq_size);
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  ~basic_string((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                 *)&size);
  mxx::comm::~comm((comm *)((long)&vec.field_2 + 8));
  return;
}

Assistant:

TEST(MxxDistribution, StableScatterBlockDistr) {
    mxx::comm c;
    std::basic_string<unsigned char> vec;
    size_t size = 40;
    if (c.rank() == c.size() / 2) {
        vec.resize(size);
        for (size_t i = 0; i < size; ++i) {
            vec[i] = static_cast<unsigned char>(i % 256);
        }
    }
    // test non-inplace
    std::basic_string<unsigned char> x = mxx::stable_distribute(vec, c);
    // test inplace
    mxx::stable_distribute_inplace(vec, c);

    size_t eq_size = size / c.size();
    if ((size_t)c.rank() < size % c.size())
        eq_size+=1;
    size_t prefix = mxx::exscan(eq_size, c);

    ASSERT_EQ(eq_size, x.size());
    ASSERT_EQ(eq_size, vec.size());

    for (size_t i = 0; i < eq_size; ++i) {
        ASSERT_EQ(static_cast<unsigned char>((prefix + i) % 256), x[i]);
        ASSERT_EQ(static_cast<unsigned char>((prefix + i) % 256), vec[i]);
    }
}